

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NekoLib.hpp
# Opt level: O0

FunctionReturned *
readFloat(FunctionReturned *__return_storage_ptr__,vector<Item,_std::allocator<Item>_> *input)

{
  size_type sVar1;
  allocator<char> local_181;
  string local_180;
  string local_160;
  Token local_140;
  Item local_118;
  undefined4 local_a4;
  Exception local_a0;
  string local_98;
  Token local_78;
  undefined1 local_40 [8];
  string s;
  vector<Item,_std::allocator<Item>_> *input_local;
  
  sVar1 = std::vector<Item,_std::allocator<Item>_>::size(input);
  if (sVar1 == 0) {
    std::__cxx11::string::string((string *)local_40);
    std::operator>>((istream *)&std::cin,(string *)local_40);
    std::__cxx11::string::string
              ((string *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    getToken(&local_78,&local_98);
    Token::~Token(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    if (local_78.type == FloatNumber) {
      std::__cxx11::string::string
                ((string *)&local_160,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      getToken(&local_140,&local_160);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"Float",&local_181);
      Item::Item(&local_118,&local_140,&local_180);
      FunctionReturned::FunctionReturned(__return_storage_ptr__,&local_118);
      Item::~Item(&local_118);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator(&local_181);
      Token::~Token(&local_140);
      std::__cxx11::string::~string((string *)&local_160);
    }
    else {
      Exception::Exception(&local_a0,InputError);
      FunctionReturned::FunctionReturned(__return_storage_ptr__,local_a0);
    }
    local_a4 = 1;
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    Exception::Exception((Exception *)((long)&s.field_2 + 8),FunctionArgumentExcess);
    FunctionReturned::FunctionReturned(__return_storage_ptr__,(Exception)s.field_2._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

FunctionReturned readFloat(vector<Item> &input) {
	if (input.size() > 0) {
		return Exception(FunctionArgumentExcess);
	}
	string s;
	cin >> s;
	if (getToken(s).type != FloatNumber) {
		return Exception(InputError);
	}
	return Item(getToken(s), "Float");
}